

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlfparser.h
# Opt level: O3

void xlfparser::_infer_token_subtypes<wchar_t>
               (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *tokens,
               Options<wchar_t> *options,wchar_t *formula,size_t size)

{
  wchar_t wVar1;
  ulong uVar2;
  bool bVar3;
  wostream *pwVar4;
  undefined8 uVar5;
  out_of_range *this;
  pointer pTVar6;
  basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> number_re;
  basic_stringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> number_re_ss;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1f8;
  basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> local_1d8;
  wstringstream local_1b8 [16];
  wostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::wstringstream::wstringstream(local_1b8);
  pwVar4 = std::operator<<(local_1a8,"^\\d+(\\");
  local_1f8._M_dataplus._M_p._0_4_ = L'.';
  if ((options->decimal_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
      super__Optional_payload_base<wchar_t>._M_engaged != false) {
    local_1f8._M_dataplus._M_p._0_4_ =
         (options->decimal_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
         super__Optional_payload_base<wchar_t>._M_payload._M_value;
  }
  pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,(wchar_t *)&local_1f8,1);
  std::operator<<(pwVar4,"\\d+)?(E[+-]\\d+)?$");
  std::__cxx11::wstringbuf::str();
  std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
  basic_regex<std::char_traits<wchar_t>,std::allocator<wchar_t>>
            ((basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>> *)&local_1d8,&local_1f8,0x11)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity * 4 + 4);
  }
  pTVar6 = (tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if (pTVar6 != (tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    do {
      uVar2 = pTVar6->m_start;
      if ((size <= uVar2) || (size <= pTVar6->m_end)) {
        this = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this,"Token index out of range");
        __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      if (pTVar6->m_type == Operand) {
        if (pTVar6->m_subtype == None) {
          local_1f8.field_2._M_allocated_capacity = 0;
          local_1f8.field_2._8_8_ = 0;
          local_1f8._M_dataplus._M_p = (pointer)0x0;
          local_1f8._M_string_length = 0;
          bVar3 = std::__detail::
                  __regex_algo_impl<wchar_t_const*,std::allocator<std::__cxx11::sub_match<wchar_t_const*>>,wchar_t,std::__cxx11::regex_traits<wchar_t>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (formula + uVar2,formula + pTVar6->m_end + 1,
                             (match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                              *)&local_1f8,&local_1d8,0);
          if (local_1f8._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_1f8._M_dataplus._M_p,
                            local_1f8.field_2._M_allocated_capacity -
                            (long)local_1f8._M_dataplus._M_p);
          }
          if (bVar3) {
            pTVar6->m_subtype = Number;
          }
          else {
            pTVar6->m_subtype = Range;
          }
        }
      }
      else if (pTVar6->m_type == OperatorInfix) {
        wVar1 = formula[uVar2];
        if (wVar1 == L'+') {
LAB_0017737b:
          if ((tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
              _M_impl.super__Vector_impl_data._M_start < pTVar6) {
            switch(pTVar6[-1].m_type) {
            case Function:
            case Subexpression:
              if (pTVar6[-1].m_subtype != Stop) goto switchD_0017739a_caseD_3;
            case Operand:
            case OperatorPostfix:
switchD_0017739a_caseD_1:
              pTVar6->m_subtype = Math;
              break;
            default:
              goto switchD_0017739a_caseD_3;
            }
            goto LAB_00177463;
          }
switchD_0017739a_caseD_3:
          uVar5 = 0x800000007;
        }
        else {
          if (wVar1 != L'@') {
            if (wVar1 == L'-') goto LAB_0017737b;
            if (pTVar6->m_subtype == None) {
              if ((uint)(wVar1 + L'\xffffffc4') < 3) {
                pTVar6->m_subtype = Logical;
              }
              else {
                if (wVar1 != L'&') goto switchD_0017739a_caseD_1;
                pTVar6->m_subtype = Concatenation;
              }
            }
            goto LAB_00177463;
          }
          uVar5 = 0xa00000007;
        }
        pTVar6->m_type = (int)uVar5;
        pTVar6->m_subtype = (int)((ulong)uVar5 >> 0x20);
      }
LAB_00177463:
      pTVar6 = pTVar6 + 1;
    } while (pTVar6 != (tokens->
                       super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex(&local_1d8)
  ;
  std::__cxx11::wstringstream::~wstringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

inline void _infer_token_subtypes(std::vector<Token>& tokens,
                                      const Options<char_type>& options,
                                      const char_type* formula,
                                      size_t size)
    {
        std::basic_stringstream<char_type> number_re_ss;
        number_re_ss << R"(^\d+(\)" << options.decimal_separator.value_or(XLFP_CHAR('.')) << R"(\d+)?(E[+-]\d+)?$)";
        const std::basic_regex<char_type> number_re(number_re_ss.str(),
            std::regex_constants::ECMAScript |
            std::regex_constants::icase);

        for (auto iter = tokens.begin(); iter != tokens.end(); ++iter)
        {
            auto& token = *iter;

            if (token.start() >= size || token.end() >= size)
                throw std::out_of_range("Token index out of range");

            if (token.type() == Token::Type::OperatorInfix && (
                    formula[token.start()] == XLFP_CHAR('-') ||
                    formula[token.start()] == XLFP_CHAR('+')))
            {
                // If the previous token was function, expression, postfix operator or operand, this token
                // is an infix operator of subtype math.
                if (iter > tokens.begin())
                {
                    auto& previous = *(iter-1);
                    if ((previous.type() == Token::Type::Function && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::Subexpression && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::OperatorPostfix) ||
                        (previous.type() == Token::Type::Operand))
                    {
                        token.subtype(Token::Subtype::Math);
                        continue;
                    }
                }

                // Otherwise assume it's a prefix operator
                token.type(Token::Type::OperatorPrefix);
                token.subtype(Token::Subtype::Math);
                continue;
            }

            if (token.type() == Token::Type::OperatorInfix && formula[token.start()] == XLFP_CHAR('+'))
            {
                // If the previous token  was function, expression, postfix operator or operand, this token
                // is an infix operator of subtype math.
                if (iter > tokens.begin())
                {
                    auto& previous = *(iter-1);
                    if ((previous.type() == Token::Type::Function && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::Subexpression && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::OperatorPostfix) ||
                        (previous.type() == Token::Type::Operand))
                    {
                        token.subtype(Token::Subtype::Math);
                        continue;
                    }
                }

                // Otherwise assume it's a prefix operator
                token.type(Token::Type::OperatorPrefix);
                token.subtype(Token::Subtype::Math);
                continue;
            }

            if (token.type() == Token::Type::OperatorInfix && formula[token.start()] == XLFP_CHAR('@'))
            {
                // Implicit intersection operator is always a prefix operator
                token.type(Token::Type::OperatorPrefix);
                token.subtype(Token::Subtype::Intersection);
            }

            if (token.type() == Token::Type::OperatorInfix && token.subtype() == Token::Subtype::None)
            {
                if (formula[token.start()] == XLFP_CHAR('<') ||
                    formula[token.start()] == XLFP_CHAR('>') ||
                    formula[token.start()] == XLFP_CHAR('='))
                {
                    token.subtype(Token::Subtype::Logical);
                }
                else if (formula[token.start()] == XLFP_CHAR('&'))
                {
                    token.subtype(Token::Subtype::Concatenation);
                }
                else
                {
                    token.subtype(Token::Subtype::Math);
                }

                continue;
            }

            // Set the operand type to Number or Range
            if (token.type() == Token::Type::Operand && token.subtype() == Token::Subtype::None)
            {
                if (std::regex_match(&formula[token.start()], &formula[token.end()]+1, number_re))
                {
                    token.subtype(Token::Subtype::Number);
                }
                else
                {
                    token.subtype(Token::Subtype::Range);
                }
            }
        }
    }